

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

int get_prim_type(char *value)

{
  int iVar1;
  char *in_RDI;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_POINT_LIST");
  if (iVar1 == 0) {
    local_c = 6;
  }
  else {
    iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_LINE_LIST");
    if (iVar1 == 0) {
      local_10 = 0;
    }
    else {
      iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_LINE_STRIP");
      if (iVar1 == 0) {
        local_14 = 1;
      }
      else {
        iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_LINE_LOOP");
        if (iVar1 == 0) {
          local_18 = 2;
        }
        else {
          iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_TRIANGLE_LIST");
          if (iVar1 == 0) {
            local_1c = 3;
          }
          else {
            iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_TRIANGLE_STRIP");
            if (iVar1 == 0) {
              local_20 = 4;
            }
            else {
              iVar1 = strcmp(in_RDI,"ALLEGRO_PRIM_TRIANGLE_FAN");
              if (iVar1 == 0) {
                local_24 = 5;
              }
              else {
                local_24 = atoi(in_RDI);
              }
              local_20 = local_24;
            }
            local_1c = local_20;
          }
          local_18 = local_1c;
        }
        local_14 = local_18;
      }
      local_10 = local_14;
    }
    local_c = local_10;
  }
  return local_c;
}

Assistant:

static int get_prim_type(char const *value)
{
   return streq(value, "ALLEGRO_PRIM_POINT_LIST") ? ALLEGRO_PRIM_POINT_LIST
      : streq(value, "ALLEGRO_PRIM_LINE_LIST") ? ALLEGRO_PRIM_LINE_LIST
      : streq(value, "ALLEGRO_PRIM_LINE_STRIP") ? ALLEGRO_PRIM_LINE_STRIP
      : streq(value, "ALLEGRO_PRIM_LINE_LOOP") ? ALLEGRO_PRIM_LINE_LOOP
      : streq(value, "ALLEGRO_PRIM_TRIANGLE_LIST") ? ALLEGRO_PRIM_TRIANGLE_LIST
      : streq(value, "ALLEGRO_PRIM_TRIANGLE_STRIP") ? ALLEGRO_PRIM_TRIANGLE_STRIP
      : streq(value, "ALLEGRO_PRIM_TRIANGLE_FAN") ? ALLEGRO_PRIM_TRIANGLE_FAN
      : atoi(value);
}